

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

void bcf_sr_remove_reader(bcf_srs_t *files,int i)

{
  int i_local;
  bcf_srs_t *files_local;
  
  if (files->samples == (char **)0x0) {
    bcf_sr_destroy1(files->readers + i);
    if (i + 1 < files->nreaders) {
      memmove(files->readers + i,files->readers + (i + 1),(long)((files->nreaders - i) + -1) * 0x60)
      ;
      memmove(files->has_line + i,files->has_line + (i + 1),(long)((files->nreaders - i) + -1) << 2)
      ;
    }
    files->nreaders = files->nreaders + -1;
    return;
  }
  __assert_fail("!files->samples",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                ,0x11a,"void bcf_sr_remove_reader(bcf_srs_t *, int)");
}

Assistant:

void bcf_sr_remove_reader(bcf_srs_t *files, int i)
{
    assert( !files->samples );  // not ready for this yet
    bcf_sr_destroy1(&files->readers[i]);
    if ( i+1 < files->nreaders )
    {
        memmove(&files->readers[i], &files->readers[i+1], (files->nreaders-i-1)*sizeof(bcf_sr_t));
        memmove(&files->has_line[i], &files->has_line[i+1], (files->nreaders-i-1)*sizeof(int));
    }
    files->nreaders--;
}